

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

Status cmSystemTools::CreateLink(string *origName,string *newName)

{
  bool bVar1;
  string local_c0;
  cmAlphaNum local_a0;
  cmAlphaNum local_70;
  string local_40;
  string *local_20;
  string *newName_local;
  string *origName_local;
  Status status;
  
  local_20 = newName;
  newName_local = origName;
  origName_local = (string *)CreateLinkQuietly(origName,newName);
  bVar1 = cmsys::Status::operator_cast_to_bool((Status *)&origName_local);
  if (!bVar1) {
    cmAlphaNum::cmAlphaNum(&local_70,"failed to create link \'");
    cmAlphaNum::cmAlphaNum(&local_a0,local_20);
    cmsys::Status::GetString_abi_cxx11_(&local_c0,(Status *)&origName_local);
    cmStrCat<char[4],std::__cxx11::string>
              (&local_40,&local_70,&local_a0,(char (*) [4])"\': ",&local_c0);
    Error(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  return (Status)origName_local;
}

Assistant:

cmsys::Status cmSystemTools::CreateLink(std::string const& origName,
                                        std::string const& newName)
{
  cmsys::Status status = cmSystemTools::CreateLinkQuietly(origName, newName);
  if (!status) {
    cmSystemTools::Error(
      cmStrCat("failed to create link '", newName, "': ", status.GetString()));
  }
  return status;
}